

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O0

Tcl_HashEntry * StringFind(Tcl_HashTable *tablePtr,char *key)

{
  uint uVar1;
  char *in_RSI;
  long *in_RDI;
  int index;
  char *p2;
  char *p1;
  Tcl_HashEntry *hPtr;
  anon_union_8_3_f08c7d79_for_key *local_30;
  char *local_28;
  Tcl_HashEntry *local_20;
  
  uVar1 = HashString(in_RSI);
  local_20 = *(Tcl_HashEntry **)(*in_RDI + (long)(int)(uVar1 & *(uint *)(in_RDI + 7)) * 8);
  do {
    if (local_20 == (Tcl_HashEntry *)0x0) {
      return (Tcl_HashEntry *)0x0;
    }
    local_30 = &local_20->key;
    for (local_28 = in_RSI; *local_28 == local_30->string[0]; local_28 = local_28 + 1) {
      if (*local_28 == '\0') {
        return local_20;
      }
      local_30 = (anon_union_8_3_f08c7d79_for_key *)((long)local_30 + 1);
    }
    local_20 = local_20->nextPtr;
  } while( true );
}

Assistant:

static Tcl_HashEntry *
StringFind(Tcl_HashTable *tablePtr, char *key)
{
    register Tcl_HashEntry *hPtr;
    register char *p1, *p2;
    int index;

    index = HashString(key) & tablePtr->mask;

    /* 
     * Search all of the entries in the appropriate bucket.
     */

    for (hPtr = tablePtr->buckets[index]; hPtr != NULL;
	 hPtr = hPtr->nextPtr) {
	for (p1 = key, p2 = hPtr->key.string;; p1++, p2++) {
	    if (*p1 != *p2) {
		break;
	    }
	    if (*p1 == '\0') {
		return hPtr;
	    }
	}
    }
    return NULL;
}